

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool createRcc(Options *options)

{
  FILE *pFVar1;
  char cVar2;
  bool bVar3;
  undefined8 uVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  char *pcVar6;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QArrayDataPointer<char16_t> local_1d0;
  QArrayDataPointer<char16_t> local_1b8;
  QArrayDataPointer<char16_t> local_1a0;
  QArrayDataPointer<char16_t> local_188;
  QArrayDataPointer<char16_t> local_170;
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  QArrayDataPointer<char16_t> local_e0;
  QArrayDataPointer<char16_t> *local_c8;
  char *local_c0;
  undefined8 local_b8;
  QArrayDataPointer<char16_t> *local_a8;
  char16_t *local_a0;
  ulong local_98;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> *local_50;
  undefined8 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8.size = 0xaaaaaaaaaaaaaaaa;
  local_f8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_f8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_68.ptr = (options->outputDirectory).d.ptr;
  local_68.size = (options->outputDirectory).d.size | 0x8000000000000000;
  local_68.d._0_1_ = 1;
  local_88.ptr = (char16_t *)0x0;
  QVar7.m_size = (size_t)"%1/assets";
  QVar7.field_0.m_data = &local_f8;
  local_88.d = (Data *)&local_68;
  QtPrivate::argToQString(QVar7,0x4000000000000009,(ArgBase **)0x1);
  local_68.size = local_f8.size | 0x8000000000000000;
  bVar3 = true;
  local_68.d = (Data *)CONCAT71(local_68.d._1_7_,1);
  local_68.ptr = local_f8.ptr;
  local_a0 = (char16_t *)0x0;
  QVar8.m_size = (size_t)"%1/android_rcc_bundle";
  QVar8.field_0.m_data_utf8 = (char *)&local_88;
  local_a8 = &local_68;
  QtPrivate::argToQString(QVar8,0x4000000000000015,(ArgBase **)0x1);
  QDir::QDir((QDir *)&local_68,(QString *)&local_88);
  cVar2 = QDir::exists();
  QDir::~QDir((QDir *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  if (cVar2 == '\0') {
    fwrite("Skipping createRCC\n",0x13,1,_stdout);
    goto LAB_00119092;
  }
  if (options->verbose == true) {
    fwrite("Create rcc bundle.\n",0x13,1,_stdout);
  }
  local_118.size = 0;
  local_118.d = (Data *)0x0;
  local_118.ptr = (char16_t *)0x0;
  if ((options->rccBinaryPath).d.size == 0) {
    local_88.d = (Data *)&options->qtLibExecsDirectory;
    local_88.ptr = (char16_t *)0x4;
    local_88.size = 0x139112;
    QStringBuilder<const_QString_&,_QLatin1String>::convertTo<QString>
              ((QString *)&local_138,(QStringBuilder<const_QString_&,_QLatin1String> *)&local_88);
    local_68.size = local_118.size;
    local_68.ptr = local_118.ptr;
    local_68.d = local_118.d;
    local_118.size = local_138.size;
    local_118.ptr = local_138.ptr;
    local_118.d = local_138.d;
    local_138.size = 0;
    local_138.d = (Data *)0x0;
    local_138.ptr = (char16_t *)0x0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
  }
  else {
    QString::operator=((QString *)&local_118,(QString *)&options->rccBinaryPath);
  }
  cVar2 = QFile::exists((QString *)&local_118);
  pFVar1 = _stderr;
  if (cVar2 == '\0') {
    QString::toLocal8Bit((QByteArray *)&local_68,(QString *)&local_118);
    aVar5.m_data_utf16 = local_68.ptr;
    if ((QArrayDataPointer<char16_t> *)local_68.ptr == (QArrayDataPointer<char16_t> *)0x0) {
      aVar5.m_data_utf8 = (char *)&QByteArray::_empty;
    }
    bVar3 = false;
    fprintf(pFVar1,"rcc not found: %s\n",aVar5.m_data);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
  }
  else {
    local_158.size = -0x5555555555555556;
    local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_158.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    QDir::currentPath();
    local_68.size = local_f8.size | 0x8000000000000000;
    local_68.d._0_1_ = 1;
    local_68.ptr = local_f8.ptr;
    local_a0 = (char16_t *)0x0;
    QVar9.m_size = (size_t)"%1/android_rcc_bundle";
    QVar9.field_0.m_data_utf8 = (char *)&local_88;
    local_a8 = &local_68;
    QtPrivate::argToQString(QVar9,0x4000000000000015,(ArgBase **)0x1);
    cVar2 = QDir::setCurrent((QString *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    pFVar1 = _stderr;
    if (cVar2 == '\0') {
      local_68.size = local_f8.size | 0x8000000000000000;
      local_68.d = (Data *)CONCAT71(local_68.d._1_7_,1);
      local_68.ptr = local_f8.ptr;
      local_a0 = (char16_t *)0x0;
      QVar18.m_size = (size_t)"%1/android_rcc_bundle";
      QVar18.field_0.m_data = &local_88;
      local_a8 = &local_68;
      QtPrivate::argToQString(QVar18,0x4000000000000015,(ArgBase **)0x1);
      QString::toLocal8Bit((QByteArray *)&local_68,(QString *)&local_88);
      aVar5.m_data_utf16 = local_68.ptr;
      if ((QArrayDataPointer<char16_t> *)local_68.ptr == (QArrayDataPointer<char16_t> *)0x0) {
        aVar5.m_data_utf8 = (char *)&QByteArray::_empty;
      }
      bVar3 = false;
      fprintf(pFVar1,"Cannot set current dir to: %s\n",aVar5.m_data);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
LAB_00119070:
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    }
    else {
      local_68.size = local_f8.size | 0x8000000000000000;
      local_68.d = (Data *)CONCAT71(local_68.d._1_7_,1);
      local_68.ptr = local_f8.ptr;
      local_88.ptr = (char16_t *)0x0;
      QVar10.m_size = (size_t)"%1/android_rcc_bundle.qrc";
      QVar10.field_0.m_data = &local_170;
      local_88.d = (Data *)&local_68;
      QtPrivate::argToQString(QVar10,0x4000000000000019,(ArgBase **)0x1);
      shellQuote((QString *)&local_e0,(QString *)&local_170);
      local_88.size = local_118.size | 0x8000000000000000;
      local_88.d = (Data *)CONCAT71(local_88.d._1_7_,1);
      local_88.ptr = local_118.ptr;
      local_98 = local_e0.size | 0x8000000000000000;
      local_a8 = (QArrayDataPointer<char16_t> *)CONCAT71(local_a8._1_7_,1);
      local_a0 = local_e0.ptr;
      local_68.ptr = (char16_t *)&local_a8;
      local_68.size = 0;
      QVar11.m_size = (size_t)"%1 --project -o %2";
      QVar11.field_0.m_data = &local_c8;
      local_68.d = (Data *)&local_88;
      QtPrivate::argToQString(QVar11,0x4000000000000012,(ArgBase **)0x2);
      bVar3 = runCommand(options,(QString *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
      if (bVar3) {
        local_68.size = local_f8.size | 0x8000000000000000;
        pcVar6 = (char *)0x0;
        bVar3 = options->isZstdCompressionEnabled == false;
        if (bVar3) {
          pcVar6 = "--no-zstd";
        }
        local_68.d._0_1_ = 1;
        local_68.ptr = local_f8.ptr;
        uVar4 = 0x4000000000000009;
        if (!bVar3) {
          uVar4 = 0x4000000000000000;
        }
        local_a0 = (char16_t *)0x0;
        QVar12.m_size = (size_t)"%1/android_rcc_bundle.qrc";
        QVar12.field_0.m_data_utf8 = (char *)&local_88;
        local_a8 = &local_68;
        QtPrivate::argToQString(QVar12,0x4000000000000019,(ArgBase **)0x1);
        local_68.size = local_f8.size | 0x8000000000000000;
        local_68.d._0_1_ = 1;
        local_68.ptr = local_f8.ptr;
        local_c0 = (char *)0x0;
        QVar13.m_size = (size_t)"%1/android_rcc_bundle/android_rcc_bundle.qrc";
        QVar13.field_0.m_data_utf8 = (char *)&local_a8;
        local_c8 = &local_68;
        QtPrivate::argToQString(QVar13,0x400000000000002c,(ArgBase **)0x1);
        QFile::rename((QString *)&local_88,(QString *)&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        latin1.m_data = "--root=/android_rcc_bundle/";
        latin1.m_size = 0x1b;
        QString::QString((QString *)&local_1a0,latin1);
        shellQuote((QString *)&local_188,(QString *)&local_1a0);
        local_68.size = local_f8.size | 0x8000000000000000;
        local_68.d = (Data *)CONCAT71(local_68.d._1_7_,1);
        local_68.ptr = local_f8.ptr;
        local_88.d = (Data *)&local_68;
        local_88.ptr = (char16_t *)0x0;
        QVar14.m_size = (size_t)"%1/android_rcc_bundle.rcc";
        QVar14.field_0.m_data = &local_1d0;
        QtPrivate::argToQString(QVar14,0x4000000000000019,(ArgBase **)0x1);
        shellQuote((QString *)&local_1b8,(QString *)&local_1d0);
        local_88.size = local_118.size | 0x8000000000000000;
        local_88.d = (Data *)CONCAT71(local_88.d._1_7_,1);
        local_88.ptr = local_118.ptr;
        local_98 = local_188.size | 0x8000000000000000;
        local_a8 = (QArrayDataPointer<char16_t> *)CONCAT71(local_a8._1_7_,1);
        local_a0 = local_188.ptr;
        local_68.size = (qsizetype)&local_c8;
        local_c8 = (QArrayDataPointer<char16_t> *)CONCAT71(local_c8._1_7_,1);
        local_e0.size = local_1b8.size | 0x8000000000000000;
        local_e0.d._0_1_ = 1;
        local_e0.ptr = local_1b8.ptr;
        local_50 = &local_e0;
        local_48 = 0;
        QVar15.m_size = (size_t)"%1 %2 %3 --binary -o %4 android_rcc_bundle.qrc";
        QVar15.field_0.m_data = &local_170;
        local_c0 = pcVar6;
        local_b8 = uVar4;
        local_68.d = (Data *)&local_88;
        local_68.ptr = (char16_t *)&local_a8;
        QtPrivate::argToQString(QVar15,0x400000000000002e,(ArgBase **)0x4);
        bVar3 = runCommand(options,(QString *)&local_170);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1d0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_188);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1a0);
        cVar2 = QDir::setCurrent((QString *)&local_158);
        pFVar1 = _stderr;
        if (cVar2 == '\0') {
          QString::toLocal8Bit((QByteArray *)&local_68,(QString *)&local_158);
          aVar5.m_data_utf16 = local_68.ptr;
          if ((QArrayDataPointer<char16_t> *)local_68.ptr == (QArrayDataPointer<char16_t> *)0x0) {
            aVar5.m_data_utf8 = (char *)&QByteArray::_empty;
          }
          bVar3 = false;
          fprintf(pFVar1,"Cannot set current dir to: %s\n",aVar5.m_data);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68);
        }
        else if (options->noRccBundleCleanup == false) {
          local_68.size = local_f8.size | 0x8000000000000000;
          local_68.d._0_1_ = 1;
          local_68.ptr = local_f8.ptr;
          local_a0 = (char16_t *)0x0;
          QVar16.m_size = (size_t)"%1/android_rcc_bundle.qrc";
          QVar16.field_0.m_data_utf8 = (char *)&local_88;
          local_a8 = &local_68;
          QtPrivate::argToQString(QVar16,0x4000000000000019,(ArgBase **)0x1);
          QFile::remove((QString *)&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          local_68.size = local_f8.size | 0x8000000000000000;
          local_68.d = (Data *)CONCAT71(local_68.d._1_7_,1);
          local_68.ptr = local_f8.ptr;
          local_a0 = (char16_t *)0x0;
          QVar17.m_size = (size_t)"%1/android_rcc_bundle";
          QVar17.field_0.m_data_utf8 = (char *)&local_88;
          local_a8 = &local_68;
          QtPrivate::argToQString(QVar17,0x4000000000000015,(ArgBase **)0x1);
          QDir::QDir((QDir *)&local_68,(QString *)&local_88);
          QDir::removeRecursively();
          QDir::~QDir((QDir *)&local_68);
          goto LAB_00119070;
        }
      }
      else {
        bVar3 = false;
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
LAB_00119092:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool createRcc(const Options &options)
{
    auto assetsDir = "%1/assets"_L1.arg(options.outputDirectory);
    if (!QDir{"%1/android_rcc_bundle"_L1.arg(assetsDir)}.exists()) {
        fprintf(stdout, "Skipping createRCC\n");
        return true;
    }

    if (options.verbose)
        fprintf(stdout, "Create rcc bundle.\n");


    QString rcc;
    if (!options.rccBinaryPath.isEmpty()) {
        rcc = options.rccBinaryPath;
    } else {
        rcc = execSuffixAppended(options.qtLibExecsDirectory + "/rcc"_L1);
    }

    if (!QFile::exists(rcc)) {
        fprintf(stderr, "rcc not found: %s\n", qPrintable(rcc));
        return false;
    }
    auto currentDir = QDir::currentPath();
    if (!QDir::setCurrent("%1/android_rcc_bundle"_L1.arg(assetsDir))) {
        fprintf(stderr, "Cannot set current dir to: %s\n", qPrintable("%1/android_rcc_bundle"_L1.arg(assetsDir)));
        return false;
    }

    bool res = runCommand(options, "%1 --project -o %2"_L1.arg(rcc, shellQuote("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir))));
    if (!res)
        return false;

    QLatin1StringView noZstd;
    if (!options.isZstdCompressionEnabled)
        noZstd = "--no-zstd"_L1;

    QFile::rename("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir), "%1/android_rcc_bundle/android_rcc_bundle.qrc"_L1.arg(assetsDir));

    res = runCommand(options, "%1 %2 %3 --binary -o %4 android_rcc_bundle.qrc"_L1.arg(rcc, shellQuote("--root=/android_rcc_bundle/"_L1),
                                                                                      noZstd,
                                                                                      shellQuote("%1/android_rcc_bundle.rcc"_L1.arg(assetsDir))));
    if (!QDir::setCurrent(currentDir)) {
        fprintf(stderr, "Cannot set current dir to: %s\n", qPrintable(currentDir));
        return false;
    }
    if (!options.noRccBundleCleanup) {
        QFile::remove("%1/android_rcc_bundle.qrc"_L1.arg(assetsDir));
        QDir{"%1/android_rcc_bundle"_L1.arg(assetsDir)}.removeRecursively();
    }
    return res;
}